

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_util.cpp
# Opt level: O2

void duckdb::ExtensionUtil::RegisterCollation(DatabaseInstance *db,CreateCollationInfo *info)

{
  CatalogTransaction transaction;
  CatalogTransaction transaction_00;
  Catalog *this;
  CatalogTransaction data;
  CreateScalarFunctionInfo finfo;
  CatalogTransaction local_328;
  ScalarFunction local_300;
  CreateScalarFunctionInfo local_1d8;
  
  this = Catalog::GetSystemCatalog(db);
  CatalogTransaction::GetSystemTransaction(&local_328,db);
  (info->super_CreateInfo).on_conflict = IGNORE_ON_CONFLICT;
  transaction.context.ptr = local_328.context.ptr;
  transaction.db.ptr = local_328.db.ptr;
  transaction.transaction.ptr = local_328.transaction.ptr;
  transaction.transaction_id = local_328.transaction_id;
  transaction.start_time = local_328.start_time;
  Catalog::CreateCollation(this,transaction,info);
  ScalarFunction::ScalarFunction(&local_300,&info->function);
  CreateScalarFunctionInfo::CreateScalarFunctionInfo(&local_1d8,&local_300);
  ScalarFunction::~ScalarFunction(&local_300);
  local_1d8.super_CreateFunctionInfo.super_CreateInfo.on_conflict = IGNORE_ON_CONFLICT;
  transaction_00.context.ptr = local_328.context.ptr;
  transaction_00.db.ptr = local_328.db.ptr;
  transaction_00.transaction.ptr = local_328.transaction.ptr;
  transaction_00.transaction_id = local_328.transaction_id;
  transaction_00.start_time = local_328.start_time;
  Catalog::CreateFunction(this,transaction_00,&local_1d8.super_CreateFunctionInfo);
  CreateScalarFunctionInfo::~CreateScalarFunctionInfo(&local_1d8);
  return;
}

Assistant:

void ExtensionUtil::RegisterCollation(DatabaseInstance &db, CreateCollationInfo &info) {
	auto &system_catalog = Catalog::GetSystemCatalog(db);
	auto data = CatalogTransaction::GetSystemTransaction(db);
	info.on_conflict = OnCreateConflict::IGNORE_ON_CONFLICT;
	system_catalog.CreateCollation(data, info);

	// Also register as a function for serialisation
	CreateScalarFunctionInfo finfo(info.function);
	finfo.on_conflict = OnCreateConflict::IGNORE_ON_CONFLICT;
	system_catalog.CreateFunction(data, finfo);
}